

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

matrix2f * __thiscall tinyusdz::value::matrix2f::operator=(matrix2f *this,matrix2d *src)

{
  ulong local_28;
  size_t i;
  size_t j;
  matrix2d *src_local;
  matrix2f *this_local;
  
  for (i = 0; i < 2; i = i + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      this->m[i][local_28] = (float)src->m[i][local_28];
    }
  }
  return this;
}

Assistant:

matrix2f &matrix2f::operator=(const matrix2d &src) {

  for (size_t j = 0; j < 2; j++) {
    for (size_t i = 0; i < 2; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}